

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis_helper.c
# Opt level: O1

uint64_t helper_fcmpne16(uint64_t src1,uint64_t src2)

{
  ulong uVar1;
  
  uVar1 = src1 ^ src2;
  return (ulong)((short)uVar1 != 0) + (ulong)(uVar1 >> 0x30 != 0) * 8 +
         (ulong)((short)(uVar1 >> 0x10) != 0) * 2 + (ulong)((short)(uVar1 >> 0x20) != 0) * 4;
}

Assistant:

uint64_t helper_pdist(uint64_t sum, uint64_t src1, uint64_t src2)
{
    int i;
    for (i = 0; i < 8; i++) {
        int s1, s2;

        s1 = (src1 >> (56 - (i * 8))) & 0xff;
        s2 = (src2 >> (56 - (i * 8))) & 0xff;

        /* Absolute value of difference. */
        s1 -= s2;
        if (s1 < 0) {
            s1 = -s1;
        }

        sum += s1;
    }

    return sum;
}